

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O3

void __thiscall xray_re::xr_envelope::insert_key(xr_envelope *this,xr_key *key)

{
  pointer *pppxVar1;
  float fVar2;
  xr_key **ppxVar3;
  iterator __position;
  iterator __position_00;
  xr_key *local_8;
  
  ppxVar3 = (this->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (this->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_8 = key;
  if (ppxVar3 == __position._M_current) {
    if (ppxVar3 ==
        (this->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>>::
      _M_realloc_insert<xray_re::xr_key*const&>
                ((vector<xray_re::xr_key*,std::allocator<xray_re::xr_key*>> *)&this->m_keys,
                 __position,&local_8);
    }
    else {
      *__position._M_current = key;
      pppxVar1 = &(this->m_keys).
                  super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppxVar1 = *pppxVar1 + 1;
    }
  }
  else {
    if ((long)__position._M_current - (long)ppxVar3 == 8) {
      __position_00._M_current = __position._M_current;
      if (key->time <= (*ppxVar3)->time && (*ppxVar3)->time != key->time) {
        __position_00._M_current = ppxVar3;
      }
    }
    else {
      fVar2 = key->time;
      __position_00._M_current = ppxVar3;
      if (((*ppxVar3)->time <= fVar2) &&
         (__position_00._M_current = __position._M_current,
         fVar2 < __position._M_current[-1]->time || fVar2 == __position._M_current[-1]->time)) {
        __position_00._M_current = ppxVar3 + -1;
        do {
          ppxVar3 = __position_00._M_current + 2;
          __position_00._M_current = __position_00._M_current + 1;
        } while ((*ppxVar3)->time <= fVar2 && fVar2 != (*ppxVar3)->time);
      }
    }
    std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::insert
              (&this->m_keys,(const_iterator)__position_00._M_current,&local_8);
  }
  return;
}

Assistant:

void xr_envelope::insert_key(xr_key* key)
{
	if (m_keys.empty()) {
		m_keys.push_back(key);
	} else if (m_keys.size() == 1) {
		m_keys.insert((key->time < m_keys.front()->time) ? m_keys.begin() : m_keys.end(), key);
	} else {
		xr_key* skey = m_keys.front();
		xr_key* ekey = m_keys.back();

		xr_key_vec_it it;
		float time = key->time;
		if (time < skey->time) {
			it = m_keys.begin();
		} else if (ekey->time < time) {
			it = m_keys.end();
		} else {
			for (it = m_keys.begin() + 1; (*it)->time < time; ++it) {}
			--it;
		}
		m_keys.insert(it, key);
	}
}